

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_subx_mm_32(m68k_info *info)

{
  build_mm(info,0x15d,'\x04',0);
  return;
}

Assistant:

static void d68000_subx_mm_32(m68k_info *info)
{
	build_mm(info, M68K_INS_SUBX, 4, 0);
}